

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_obj_to_desc(JSContext *ctx,JSPropertyDescriptor *d,JSValue desc)

{
  int iVar1;
  uint uVar2;
  JSPropertyDescriptor *pJVar3;
  ulong uVar4;
  char *fmt;
  ulong uVar5;
  ulong uVar6;
  JSValue v;
  JSValue JVar7;
  JSValue JVar8;
  int64_t iStackY_80;
  uint local_64;
  ulong local_60;
  ulong local_58;
  int64_t local_50;
  JSValue local_48;
  
  if ((int)desc.tag != -1) {
    JS_ThrowTypeErrorNotAnObject(ctx);
    return -1;
  }
  iVar1 = JS_HasProperty(ctx,desc,0x3d);
  iStackY_80 = 3;
  if (iVar1 != 0) {
    local_58 = 0x3d;
    JVar7 = JS_GetPropertyInternal(ctx,desc,0x3d,desc,0);
    if ((int)JVar7.tag != 6) {
      iVar1 = JS_ToBoolFree(ctx,JVar7);
      local_64 = 0x101 - (iVar1 == 0);
      goto LAB_0013aeb3;
    }
LAB_0013af41:
    uVar6 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_60 = 0;
    local_48 = (JSValue)(ZEXT816(3) << 0x40);
    local_50 = iStackY_80;
    goto LAB_0013af53;
  }
  local_64 = 0;
LAB_0013aeb3:
  iVar1 = JS_HasProperty(ctx,desc,0x3e);
  if (iVar1 != 0) {
    local_58 = 0x3e;
    JVar7 = JS_GetPropertyInternal(ctx,desc,0x3e,desc,0);
    if ((int)JVar7.tag == 6) goto LAB_0013af41;
    iVar1 = JS_ToBoolFree(ctx,JVar7);
    local_64 = (uint)(iVar1 != 0) * 2 | local_64 | 0x200;
  }
  iVar1 = JS_HasProperty(ctx,desc,0x3f);
  if (iVar1 != 0) {
    local_58 = 0x3f;
    JVar7 = JS_GetPropertyInternal(ctx,desc,0x3f,desc,0);
    if ((int)JVar7.tag == 6) goto LAB_0013af41;
    iVar1 = JS_ToBoolFree(ctx,JVar7);
    local_64 = (uint)(iVar1 != 0) << 2 | local_64 | 0x400;
  }
  uVar2 = JS_HasProperty(ctx,desc,0x40);
  local_58 = (ulong)uVar2;
  if (uVar2 == 0) {
    local_48 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    local_48 = JS_GetPropertyInternal(ctx,desc,0x40,desc,0);
    local_58 = (ulong)local_48.u.ptr >> 0x20;
    if ((int)local_48.tag == 6) {
      iStackY_80 = 3;
      uVar6 = 0;
      uVar4 = 0;
      uVar5 = 0;
      local_60 = 0;
      local_50 = iStackY_80;
      goto LAB_0013af53;
    }
    local_64 = local_64 | 0x2000;
  }
  uVar2 = JS_HasProperty(ctx,desc,0x41);
  local_60 = (ulong)uVar2;
  if (uVar2 == 0) {
    JVar7 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0013b0cf:
    local_50 = JVar7.tag;
    iVar1 = JS_HasProperty(ctx,desc,0x42);
    if (iVar1 == 0) {
      JVar8 = (JSValue)(ZEXT816(3) << 0x40);
      pJVar3 = d;
LAB_0013b15b:
      if ((local_64 & 0x1800) == 0 || (local_64 & 0x2200) == 0) {
        d->flags = local_64;
        (d->value).u.ptr = (void *)((ulong)(uint)local_48.u._0_4_ | local_58 << 0x20);
        (d->value).tag = local_48.tag;
        (d->getter).u.ptr = (void *)((ulong)JVar7.u.ptr & 0xffffffff | local_60 << 0x20);
        (d->getter).tag = local_50;
        (d->setter).u.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | (long)pJVar3 << 0x20);
        (d->setter).tag = JVar8.tag;
        return 0;
      }
      fmt = "cannot have setter/getter and value or writable";
    }
    else {
      local_64 = local_64 | 0x1000;
      JVar8 = JS_GetPropertyInternal(ctx,desc,0x42,desc,0);
      iStackY_80 = JVar8.tag;
      pJVar3 = (JSPropertyDescriptor *)((ulong)JVar8.u.ptr >> 0x20);
      if ((int)JVar8.tag == 3) goto LAB_0013b15b;
      fmt = "invalid setter";
      if ((int)JVar8.tag != 6) {
        iVar1 = JS_IsFunction(ctx,JVar8);
        uVar2 = JVar8.u._0_4_;
        if (iVar1 == 0) {
          fmt = "invalid setter";
          d = pJVar3;
          goto LAB_0013b1d8;
        }
        goto LAB_0013b15b;
      }
    }
    iStackY_80 = JVar8.tag;
    uVar2 = JVar8.u._0_4_;
    d = pJVar3;
  }
  else {
    local_64 = local_64 | 0x800;
    JVar7 = JS_GetPropertyInternal(ctx,desc,0x41,desc,0);
    local_60 = (ulong)JVar7.u.ptr >> 0x20;
    if ((int)JVar7.tag == 3) goto LAB_0013b0cf;
    iStackY_80 = 3;
    fmt = "invalid getter";
    if ((int)JVar7.tag == 6) {
      uVar2 = 0;
    }
    else {
      iVar1 = JS_IsFunction(ctx,JVar7);
      if (iVar1 != 0) goto LAB_0013b0cf;
      iStackY_80 = 3;
      uVar2 = 0;
      fmt = "invalid getter";
    }
  }
LAB_0013b1d8:
  local_50 = JVar7.tag;
  JS_ThrowTypeError(ctx,fmt);
  local_60 = local_60 << 0x20;
  uVar5 = (ulong)JVar7.u.ptr & 0xffffffff;
  uVar4 = (long)d << 0x20;
  uVar6 = (ulong)uVar2;
LAB_0013af53:
  JVar7.tag = local_48.tag;
  JVar7.u.ptr = (void *)((ulong)local_48.u.ptr & 0xffffffff | local_58 << 0x20);
  JS_FreeValue(ctx,JVar7);
  JVar8.tag = local_50;
  JVar8.u.ptr = (void *)(uVar5 | local_60);
  JS_FreeValue(ctx,JVar8);
  v.tag = iStackY_80;
  v.u.ptr = (void *)(uVar6 | uVar4);
  JS_FreeValue(ctx,v);
  return -1;
}

Assistant:

static int js_obj_to_desc(JSContext *ctx, JSPropertyDescriptor *d,
                          JSValueConst desc)
{
    JSValue val, getter, setter;
    int flags;

    if (!JS_IsObject(desc)) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    flags = 0;
    val = JS_UNDEFINED;
    getter = JS_UNDEFINED;
    setter = JS_UNDEFINED;
    if (JS_HasProperty(ctx, desc, JS_ATOM_configurable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_configurable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_CONFIGURABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_CONFIGURABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_writable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_writable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_WRITABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_WRITABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_enumerable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_enumerable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_ENUMERABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_ENUMERABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_value)) {
        flags |= JS_PROP_HAS_VALUE;
        val = JS_GetProperty(ctx, desc, JS_ATOM_value);
        if (JS_IsException(val))
            goto fail;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_get)) {
        flags |= JS_PROP_HAS_GET;
        getter = JS_GetProperty(ctx, desc, JS_ATOM_get);
        if (JS_IsException(getter) ||
            !(JS_IsUndefined(getter) || JS_IsFunction(ctx, getter))) {
            JS_ThrowTypeError(ctx, "invalid getter");
            goto fail;
        }
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_set)) {
        flags |= JS_PROP_HAS_SET;
        setter = JS_GetProperty(ctx, desc, JS_ATOM_set);
        if (JS_IsException(setter) ||
            !(JS_IsUndefined(setter) || JS_IsFunction(ctx, setter))) {
            JS_ThrowTypeError(ctx, "invalid setter");
            goto fail;
        }
    }
    if ((flags & (JS_PROP_HAS_SET | JS_PROP_HAS_GET)) &&
        (flags & (JS_PROP_HAS_VALUE | JS_PROP_HAS_WRITABLE))) {
        JS_ThrowTypeError(ctx, "cannot have setter/getter and value or writable");
        goto fail;
    }
    d->flags = flags;
    d->value = val;
    d->getter = getter;
    d->setter = setter;
    return 0;
 fail:
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, getter);
    JS_FreeValue(ctx, setter);
    return -1;
}